

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn_aarch64.c
# Opt level: O3

void uc_init_aarch64(uc_struct_conflict1 *uc)

{
  uc->reg_read_arm = reg_read_aarch64;
  uc->reg_write_arm = reg_write_aarch64;
  uc->reg_reset = reg_reset;
  uc->set_pc = arm64_set_pc;
  uc->get_pc = arm64_get_pc;
  uc->release = arm64_release;
  uc->cpus_init = arm64_cpus_init;
  uc->cpu_context_size = 0x3138;
  uc->write_mem = cpu_physical_mem_write;
  uc->read_mem = cpu_physical_mem_read;
  uc->tcg_exec_init_arm = tcg_exec_init_aarch64;
  uc->cpu_exec_init_all_arm = cpu_exec_init_all_aarch64;
  uc->vm_start_arm = vm_start_aarch64;
  uc->memory_map_arm = memory_map_aarch64;
  uc->memory_map_ptr_arm = memory_map_ptr_aarch64;
  uc->memory_unmap_arm = memory_unmap_aarch64;
  uc->memory_moveout_arm = memory_moveout_aarch64;
  uc->memory_movein_arm = memory_movein_aarch64;
  uc->readonly_mem = memory_region_set_readonly_aarch64;
  uc->target_page = target_page_init;
  uc->softfloat_initialize = softfloat_init_aarch64;
  uc->tcg_flush_tlb = tcg_flush_softmmu_tlb_aarch64;
  uc->memory_map_io_arm = memory_map_io_aarch64;
  uc->set_tlb = uc_set_tlb;
  uc->memory_mapping = find_memory_mapping_aarch64;
  uc->memory_filter_subregions = memory_region_filter_subregions_aarch64;
  uc->memory_cow_arm = memory_cow_aarch64;
  return;
}

Assistant:

DEFAULT_VISIBILITY
void uc_init(struct uc_struct *uc)
{
    uc->reg_read = reg_read;
    uc->reg_write = reg_write;
    uc->reg_reset = reg_reset;
    uc->set_pc = arm64_set_pc;
    uc->get_pc = arm64_get_pc;
    uc->release = arm64_release;
    uc->cpus_init = arm64_cpus_init;
    uc->cpu_context_size = offsetof(CPUARMState, cpu_watchpoint);
    uc_common_init(uc);
}